

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  byte bVar1;
  uint uVar2;
  vec<Minisat::Solver::Watcher,_int> *pvVar3;
  VarData *pVVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  if (0 < this->next_var) {
    lVar10 = 0;
    do {
      lVar14 = 0;
      bVar5 = true;
      do {
        bVar6 = bVar5;
        pvVar3 = (this->watches).occs.map.data;
        if (0 < pvVar3[lVar14 + lVar10 * 2].sz) {
          lVar15 = 0;
          lVar9 = 0;
          do {
            ClauseAllocator::reloc
                      (&this->ca,(CRef *)((long)&(pvVar3[lVar14 + lVar10 * 2].data)->cref + lVar15),
                       to);
            lVar9 = lVar9 + 1;
            lVar15 = lVar15 + 8;
          } while (lVar9 < pvVar3[lVar14 + lVar10 * 2].sz);
        }
        lVar14 = 1;
        bVar5 = false;
      } while (bVar6);
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->next_var);
  }
  iVar7 = (this->trail).sz;
  if (0 < iVar7) {
    lVar10 = 0;
    do {
      pVVar4 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      iVar8 = (this->trail).data[lVar10].x >> 1;
      uVar11 = (ulong)pVVar4[iVar8].reason;
      if ((uVar11 != 0xffffffff) &&
         ((puVar12 = (this->ca).ra.memory, (puVar12[uVar11] & 0x10) != 0 ||
          (((uVar2 = puVar12[uVar11 + 1], iVar13 = (int)uVar2 >> 1,
            bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                    .map.data[iVar13].value,
            ((byte)uVar2 & 1 ^ bVar1) == l_True && (l_True & 2) == 0 || (bVar1 & l_True & 2) != 0 &&
            (pVVar4[iVar13].reason != 0xffffffff)) &&
           (pVVar4[iVar13].reason == pVVar4[iVar8].reason)))))) {
        ClauseAllocator::reloc(&this->ca,&pVVar4[iVar8].reason,to);
        iVar7 = (this->trail).sz;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  iVar7 = (this->learnts).sz;
  if (0 < iVar7) {
    puVar12 = (this->learnts).data;
    lVar14 = 0;
    lVar10 = 0;
    iVar8 = 0;
    do {
      if (((this->ca).ra.memory[*(uint *)((long)puVar12 + lVar14)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar12 + lVar14),to);
        puVar12 = (this->learnts).data;
        lVar9 = (long)iVar8;
        iVar8 = iVar8 + 1;
        puVar12[lVar9] = *(uint *)((long)puVar12 + lVar14);
        iVar7 = (this->learnts).sz;
      }
      lVar10 = lVar10 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar10 < iVar7);
    if (0 < (int)lVar10 - iVar8) {
      (this->learnts).sz = (iVar7 + iVar8) - (int)lVar10;
    }
  }
  iVar7 = (this->clauses).sz;
  if (0 < iVar7) {
    puVar12 = (this->clauses).data;
    lVar14 = 0;
    lVar10 = 0;
    iVar8 = 0;
    do {
      if (((this->ca).ra.memory[*(uint *)((long)puVar12 + lVar14)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar12 + lVar14),to);
        puVar12 = (this->clauses).data;
        lVar9 = (long)iVar8;
        iVar8 = iVar8 + 1;
        puVar12[lVar9] = *(uint *)((long)puVar12 + lVar14);
        iVar7 = (this->clauses).sz;
      }
      lVar10 = lVar10 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar10 < iVar7);
    if (0 < (int)lVar10 - iVar8) {
      (this->clauses).sz = (iVar7 + iVar8) - (int)lVar10;
    }
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}